

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O0

void generate_license(string *fname,
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *other_args)

{
  undefined1 auVar1 [16];
  unit_test_log_t *puVar2;
  bool bVar3;
  size_type sVar4;
  ulong uVar5;
  char *pcVar6;
  lazy_ostream *plVar7;
  uint uVar8;
  undefined4 local_1e4;
  basic_cstring<const_char> local_1e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1d0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  int local_188 [2];
  int sectionSize;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_170;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  SI_Error local_124;
  undefined1 local_120 [4];
  SI_Error rc;
  CSimpleIniA ini;
  undefined4 local_98 [4];
  basic_cstring<const_char> local_88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_78;
  basic_cstring<const_char> local_50;
  basic_cstring<const_char> local_40;
  int local_30;
  uint local_2c;
  int retCode;
  uint i;
  char **argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int argc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *other_args_local;
  string *fname_local;
  
  pvStack_18 = other_args;
  other_args_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)fname;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(other_args);
  argv._4_4_ = (int)sVar4 + 4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)((int)sVar4 + 5);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  _retCode = (char **)operator_new__(uVar5);
  *_retCode = "lic-generator";
  for (local_2c = 1; uVar5 = (ulong)local_2c,
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvStack_18), uVar5 <= sVar4; local_2c = local_2c + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](pvStack_18,(ulong)(local_2c - 1));
    pcVar6 = (char *)std::__cxx11::string::c_str();
    _retCode[local_2c] = pcVar6;
  }
  _retCode[local_2c] = "-o";
  local_2c = local_2c + 1;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  uVar8 = local_2c + 1;
  _retCode[local_2c] = pcVar6;
  local_2c = local_2c + 2;
  _retCode[uVar8] = "TEST";
  local_30 = license::LicenseGenerator::generateLicense(argv._4_4_,_retCode);
  if (_retCode != (char **)0x0) {
    operator_delete__(_retCode);
  }
  do {
    puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_50);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_40,0x20,&local_50);
    plVar7 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_78,plVar7,(char (*) [1])"");
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
               ,0x7b);
    local_98[0] = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_78,&local_88,0x20,1,2,&local_30,"retCode",local_98,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_78);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  boost::filesystem::path::path((path *)&ini.m_bStoreIsUtf8,(string_type *)other_args_local);
  bVar3 = boost::filesystem::exists((path *)&ini.m_bStoreIsUtf8);
  if (bVar3) {
    boost::filesystem::path::~path((path *)&ini.m_bStoreIsUtf8);
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::CSimpleIniTempl
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_120,false,
               false,false);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    local_124 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                          ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                           local_120,pcVar6);
    do {
      puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_138,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7b);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_138,0x24,&local_148);
      plVar7 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_170,plVar7,(char (*) [1])"");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&sectionSize,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7b);
      local_188[1] = 0;
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::ge_impl,SI_Error,int>
                (&local_170,&sectionSize,0x24,1,7,&local_124,"rc",local_188 + 1,"0");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_170);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    local_188[0] = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
                             ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)
                              local_120,"TEST");
    do {
      puVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_198,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7b);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
      boost::unit_test::unit_test_log_t::set_checkpoint(puVar2,&local_198,0x26,&local_1a8);
      plVar7 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<(&local_1d0,plVar7,(char (*) [1])"");
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                 ,0x7b);
      local_1e4 = 0;
      boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::gt_impl,int,int>
                (&local_1d0,&local_1e0,0x26,1,6,local_188,"sectionSize",&local_1e4,"0");
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl(&local_1d0);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
              ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_120);
    return;
  }
  __assert_fail("fs::exists(fname)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/abernste[P]open-license-manager/test/functional/generate-license.cpp"
                ,0x21,"void generate_license(const string &, const vector<string> &)");
}

Assistant:

void generate_license(const string& fname, const vector<string>& other_args) {
	int argc = 4+other_args.size();
	const char** argv = new const char*[argc + 1];
	unsigned int i=0;
	argv[i++] = "lic-generator";
	for(;i<=other_args.size();i++){
		argv[i] = other_args[i-1].c_str();
	}
	argv[i++] = "-o";
	argv[i++] = fname.c_str();
	argv[i++] = "TEST";
	int retCode = LicenseGenerator::generateLicense(argc, argv);
	delete[] (argv);
	BOOST_CHECK_EQUAL(retCode, 0);
	BOOST_ASSERT(fs::exists(fname));
	CSimpleIniA ini;
	SI_Error rc = ini.LoadFile(fname.c_str());
	BOOST_CHECK_GE(rc,0);
	int sectionSize = ini.GetSectionSize("TEST");
	BOOST_CHECK_GT(sectionSize,0);
}